

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::AnnounceBegin
          (Error *__return_storage_ptr__,CommissionerApp *this,uint32_t aChannelMask,uint8_t aCount,
          MilliSeconds aPeriod,string *aDtsAddr)

{
  element_type *peVar1;
  int iVar2;
  char *begin;
  char *pcVar3;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar4;
  format_args args;
  string sStack_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  undefined1 local_58 [40];
  
  this_00 = &sStack_a8;
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aVar4 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aDtsAddr;
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_88._0_4_ = none_type;
    local_80._M_p = "the commissioner is not active";
    local_78 = 0x1e;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    pcVar3 = "the commissioner is not active";
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_88);
      }
    }
    args.field_1.values_ = aVar4.values_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_(&sStack_a8,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_58._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&sStack_a8);
    Error::operator=(__return_storage_ptr__,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  else {
    peVar1 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_Commissioner[0x2c])
              (local_88,peVar1,(ulong)aChannelMask,aCount,aPeriod.__r & 0xffff,aDtsAddr);
    Error::operator=(__return_storage_ptr__,(Error *)local_88);
    this_00 = (string *)&local_80;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::AnnounceBegin(uint32_t           aChannelMask,
                                     uint8_t            aCount,
                                     MilliSeconds       aPeriod,
                                     const std::string &aDtsAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->AnnounceBegin(aChannelMask, aCount, aPeriod.count(), aDtsAddr));

exit:
    return error;
}